

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeObjectiveFunction.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeObjectiveFunction::setCoor
          (FluctuatingChargeObjectiveFunction *this,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  pointer ppAVar1;
  Molecule *pMVar2;
  pointer ppAVar3;
  Atom *pAVar4;
  pointer pdVar5;
  int iVar6;
  MoleculeIterator i;
  MoleculeIterator local_28;
  
  local_28._M_node = (_Base_ptr)0x0;
  (*this->info_->sman_->_vptr_SnapshotManager[2])();
  pMVar2 = SimInfo::beginMolecule(this->info_,&local_28);
  if (pMVar2 != (Molecule *)0x0) {
    iVar6 = 0;
    do {
      ppAVar3 = (pMVar2->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar1 = (pMVar2->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar3 == ppAVar1) {
        pAVar4 = (Atom *)0x0;
      }
      else {
        pAVar4 = *ppAVar3;
      }
      if (pAVar4 != (Atom *)0x0) {
        pdVar5 = (x->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar6;
        do {
          ppAVar3 = ppAVar3 + 1;
          *(double *)
           (*(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData
                             ).flucQPos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + (pAVar4->super_StuntDouble).storage_
                     ) + (long)(pAVar4->super_StuntDouble).localIndex_ * 8) = *pdVar5;
          if (ppAVar3 == ppAVar1) {
            pAVar4 = (Atom *)0x0;
          }
          else {
            pAVar4 = *ppAVar3;
          }
          pdVar5 = pdVar5 + 1;
          iVar6 = iVar6 + 1;
        } while (pAVar4 != (Atom *)0x0);
      }
      pMVar2 = SimInfo::nextMolecule(this->info_,&local_28);
    } while (pMVar2 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void FluctuatingChargeObjectiveFunction::setCoor(
      const DynamicVector<RealType>& x) const {
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    info_->getSnapshotManager()->advance();

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        atom->setFlucQPos(x[index++]);
      }
    }
  }